

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_pfx.cpp
# Opt level: O0

void Convert32(BYTE *src,int srcpitch,void *destin,int destpitch,int destwidth,int destheight,
              fixed_t xstep,fixed_t ystep,fixed_t xfrac,fixed_t yfrac)

{
  int iVar1;
  fixed_t local_44;
  DWORD *pDStack_40;
  fixed_t xf;
  DWORD *dest;
  int savedx;
  int y;
  int x;
  int destheight_local;
  int destwidth_local;
  int destpitch_local;
  void *destin_local;
  byte *pbStack_10;
  int srcpitch_local;
  BYTE *src_local;
  
  if (destwidth != 0 || destheight != 0) {
    iVar1 = (destpitch >> 2) - destwidth;
    pDStack_40 = (DWORD *)destin;
    dest._4_4_ = destheight;
    pbStack_10 = src;
    if ((xstep == 0x10000) && (ystep == 0x10000)) {
      for (; dest._4_4_ != 0; dest._4_4_ = dest._4_4_ + -1) {
        for (savedx = destwidth >> 3; savedx != 0; savedx = savedx + -1) {
          *pDStack_40 = GPfxPal.Pal32[*pbStack_10];
          pDStack_40[1] = GPfxPal.Pal32[pbStack_10[1]];
          pDStack_40[2] = GPfxPal.Pal32[pbStack_10[2]];
          pDStack_40[3] = GPfxPal.Pal32[pbStack_10[3]];
          pDStack_40[4] = GPfxPal.Pal32[pbStack_10[4]];
          pDStack_40[5] = GPfxPal.Pal32[pbStack_10[5]];
          pDStack_40[6] = GPfxPal.Pal32[pbStack_10[6]];
          pDStack_40[7] = GPfxPal.Pal32[pbStack_10[7]];
          pDStack_40 = pDStack_40 + 8;
          pbStack_10 = pbStack_10 + 8;
        }
        for (savedx = destwidth & 7; savedx != 0; savedx = savedx + -1) {
          *pDStack_40 = GPfxPal.Pal32[*pbStack_10];
          pDStack_40 = pDStack_40 + 1;
          pbStack_10 = pbStack_10 + 1;
        }
        pDStack_40 = pDStack_40 + iVar1;
        pbStack_10 = pbStack_10 + (srcpitch - destwidth);
      }
    }
    else {
      for (; dest._4_4_ != 0; dest._4_4_ = dest._4_4_ + -1) {
        local_44 = xfrac;
        for (savedx = destwidth >> 1; savedx != 0; savedx = savedx + -1) {
          *pDStack_40 = GPfxPal.Pal32[pbStack_10[local_44 >> 0x10]];
          pDStack_40[1] = GPfxPal.Pal32[pbStack_10[xstep + local_44 >> 0x10]];
          local_44 = xstep + xstep + local_44;
          pDStack_40 = pDStack_40 + 2;
        }
        if ((destwidth & 1U) != 0) {
          *pDStack_40 = GPfxPal.Pal32[pbStack_10[local_44 >> 0x10]];
          pDStack_40 = pDStack_40 + 1;
        }
        for (yfrac = ystep + yfrac; 0xffff < yfrac; yfrac = yfrac + -0x10000) {
          pbStack_10 = pbStack_10 + srcpitch;
        }
        pDStack_40 = pDStack_40 + iVar1;
      }
    }
  }
  return;
}

Assistant:

static void Convert32 (BYTE *src, int srcpitch,
	void *destin, int destpitch, int destwidth, int destheight,
	fixed_t xstep, fixed_t ystep, fixed_t xfrac, fixed_t yfrac)
{
	if ((destwidth | destheight) == 0)
	{
		return;
	}

	int x, y, savedx;
	DWORD *dest = (DWORD *)destin;

	destpitch = (destpitch >> 2) - destwidth;
	if (xstep == FRACUNIT && ystep == FRACUNIT)
	{
		srcpitch -= destwidth;
		for (y = destheight; y != 0; y--)
		{
			for (savedx = x = destwidth, x >>= 3; x != 0; x--)
			{
				dest[0] = GPfxPal.Pal32[src[0]];
				dest[1] = GPfxPal.Pal32[src[1]];
				dest[2] = GPfxPal.Pal32[src[2]];
				dest[3] = GPfxPal.Pal32[src[3]];
				dest[4] = GPfxPal.Pal32[src[4]];
				dest[5] = GPfxPal.Pal32[src[5]];
				dest[6] = GPfxPal.Pal32[src[6]];
				dest[7] = GPfxPal.Pal32[src[7]];
				dest += 8;
				src += 8;
			}
			for (x = savedx & 7; x != 0; x--)
			{
				*dest++ = GPfxPal.Pal32[*src++];
			}
			dest += destpitch;
			src += srcpitch;
		}
	}
	else
	{
		for (y = destheight; y != 0; y--)
		{
			fixed_t xf = xfrac;
			for (savedx = x = destwidth, x >>= 1; x != 0; x--)
			{
				dest[0] = GPfxPal.Pal32[src[xf >> FRACBITS]];		xf += xstep;
				dest[1] = GPfxPal.Pal32[src[xf >> FRACBITS]];		xf += xstep;
				dest += 2;
			}
			if (savedx & 1)
			{
				*dest++ = GPfxPal.Pal32[src[xf >> FRACBITS]];
			}
			yfrac += ystep;
			while (yfrac >= FRACUNIT)
			{
				yfrac -= FRACUNIT;
				src += srcpitch;
			}
			dest += destpitch;
		}
	}
}